

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongRunningShaderTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Stress::anon_unknown_1::LongRunningShaderCase::init
          (LongRunningShaderCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  ShaderProgram *this_00;
  RenderContext *renderCtx;
  TestLog *pTVar2;
  TestError *this_01;
  MessageBuilder *pMVar3;
  MessageBuilder local_3f8;
  MessageBuilder local_278;
  undefined1 local_f1;
  ProgramSources local_f0;
  LongRunningShaderCase *local_10;
  LongRunningShaderCase *this_local;
  
  local_10 = this;
  this_00 = (ShaderProgram *)operator_new(0xd0);
  local_f1 = 1;
  renderCtx = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  genSources(&local_f0,this->m_params);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_f0);
  local_f1 = 0;
  this->m_program = this_00;
  glu::ProgramSources::~ProgramSources(&local_f0);
  pTVar2 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar2,this->m_program);
  bVar1 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar1) {
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])();
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sLongRunningShaderTests.cpp"
               ,0xdb);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  this->m_caseIterNdx = 0;
  if (this->m_params->iterCountType != ITERCOUNTTYPE_STATIC) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_278,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_278,(char (*) [34])"Loop iteration counts in range: [");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_params->minLoopIterCount);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_params->maxLoopIterCount);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x29ea7ce);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_278);
  }
  pTVar2 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_3f8,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (&local_3f8,(char (*) [35])"Number of vertices and fragments: ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_params->numInvocations);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3f8);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void LongRunningShaderCase::init (void)
{
	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), genSources(*m_params));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		deinit();
		TCU_FAIL("Failed to compile shader program");
	}

	m_caseIterNdx = 0;

	if (m_params->iterCountType != ITERCOUNTTYPE_STATIC)
	{
		m_testCtx.getLog() << TestLog::Message << "Loop iteration counts in range: [" << m_params->minLoopIterCount
											   << ", " << m_params->maxLoopIterCount << "]"
						   << TestLog::EndMessage;
	}

	m_testCtx.getLog() << TestLog::Message << "Number of vertices and fragments: " << m_params->numInvocations << TestLog::EndMessage;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass"); // Test will pass or timeout, unless driver/device crashes.
}